

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O1

bool __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::parseCDATA
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this)

{
  unsigned_long uVar1;
  unsigned_long *puVar2;
  uint uVar3;
  unsigned_long uVar4;
  unsigned_long *puVar5;
  unsigned_long *c;
  bool bVar6;
  bool bVar7;
  string<unsigned_long> local_28;
  
  uVar1 = this->P[1];
  if (uVar1 == 0x5b) {
    this->CurrentNodeType = EXN_CDATA;
    c = this->P;
    bVar7 = *c == 0;
    if (!bVar7) {
      uVar3 = 0;
      do {
        c = c + 1;
        this->P = c;
        bVar7 = *c == 0;
        if (bVar7) break;
        bVar6 = uVar3 < 7;
        uVar3 = uVar3 + 1;
      } while (bVar6);
    }
    if (!bVar7) {
      uVar4 = *this->P;
      if (uVar4 == 0) {
        bVar7 = true;
        puVar5 = (unsigned_long *)0x0;
      }
      else {
        puVar2 = this->P + -2;
        puVar5 = (unsigned_long *)0x0;
        do {
          if (((uVar4 == 0x3e) && (puVar2[1] == 0x5d)) && (*puVar2 == 0x5d)) {
            puVar5 = puVar2;
          }
          this->P = puVar2 + 3;
          uVar4 = puVar2[3];
          bVar7 = puVar5 == (unsigned_long *)0x0;
        } while ((uVar4 != 0) && (puVar2 = puVar2 + 1, puVar5 == (unsigned_long *)0x0));
      }
      if (bVar7) {
        core::string<unsigned_long>::operator=(&this->NodeName,"");
      }
      else {
        core::string<unsigned_long>::string<unsigned_long>
                  (&local_28,c,(s32)((ulong)((long)puVar5 - (long)c) >> 3));
        core::string<unsigned_long>::operator=(&this->NodeName,&local_28);
        if (local_28.array != (unsigned_long *)0x0) {
          operator_delete__(local_28.array);
        }
      }
    }
  }
  return uVar1 == 0x5b;
}

Assistant:

bool parseCDATA()
	{
		if (*(P+1) != L'[')
			return false;

		CurrentNodeType = EXN_CDATA;

		// skip '<![CDATA['
		int count=0;
		while( *P && count<8 )
		{
			++P;
			++count;
		}

		if (!*P)
			return true;

		char_type *cDataBegin = P;
		char_type *cDataEnd = 0;

		// find end of CDATA
		while(*P && !cDataEnd)
		{
			if (*P == L'>' && 
			   (*(P-1) == L']') &&
			   (*(P-2) == L']'))
			{
				cDataEnd = P - 2;
			}

			++P;
		}

		if ( cDataEnd )
			NodeName = core::string<char_type>(cDataBegin, (int)(cDataEnd - cDataBegin));
		else
			NodeName = "";

		return true;
	}